

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParser.cpp
# Opt level: O2

char * ODDLParser::OpenDDLParser::parseFloatingLiteral
                 (char *in,char *end,Value **floating,ValueType floatType)

{
  char *pcVar1;
  bool bVar2;
  char *in_00;
  Value *pVVar3;
  char *pcVar4;
  double value_00;
  double value;
  
  *floating = (Value *)0x0;
  if (in != end && in != (char *)0x0) {
    pcVar4 = end;
    in_00 = lookForNextToken<char>(in,end);
    pcVar1 = in_00;
    do {
      in = pcVar1;
      bVar2 = isSeparator<char>((ODDLParser *)(ulong)(uint)(int)*in,(char)pcVar4);
      if (in == end) break;
      pcVar1 = in + 1;
    } while (!bVar2);
    bVar2 = isHexLiteral<char>(in_00,end);
    if (bVar2) {
      parseHexaLiteral(in_00,end,floating);
    }
    else if (((byte)(*in_00 - 0x30U) < 10) || ((*in_00 == '-' && ((byte)(in_00[1] - 0x30U) < 10))))
    {
      value_00 = atof(in_00);
      if (floatType == ddl_double) {
        pVVar3 = ValueAllocator::allocPrimData(ddl_double,1);
        *floating = pVVar3;
        Value::setDouble(pVVar3,value_00);
      }
      else {
        pVVar3 = ValueAllocator::allocPrimData(ddl_float,1);
        *floating = pVVar3;
        Value::setFloat(pVVar3,(float)value_00);
      }
    }
  }
  return in;
}

Assistant:

char *OpenDDLParser::parseFloatingLiteral( char *in, char *end, Value **floating, Value::ValueType floatType) {
    *floating = ddl_nullptr;
    if( ddl_nullptr == in || in == end ) {
        return in;
    }

    in = lookForNextToken( in, end );
    char *start( in );
    while( !isSeparator( *in ) && in != end ) {
        ++in;
    }

    // parse the float value
    bool ok( false );
    if ( isHexLiteral( start, end ) ) {
        parseHexaLiteral( start, end, floating );
        return in;
    }

    if( isNumeric( *start ) ) {
        ok = true;
    } else {
        if( *start == '-' ) {
            if( isNumeric( *(start+1) ) ) {
                ok = true;
            }
        }
    }

    if( ok ) {
        if ( floatType == Value::ddl_double ) {
            const double value( atof( start ) );
            *floating = ValueAllocator::allocPrimData( Value::ddl_double );
            ( *floating )->setDouble( value );
        } else {
            const float value( ( float ) atof( start ) );
            *floating = ValueAllocator::allocPrimData( Value::ddl_float );
            ( *floating )->setFloat( value );
        }
    }

    return in;
}